

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

void duckdb::
     HistogramUpdateFunction<duckdb::HistogramGenericFunctor,duckdb::string_t,duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::map<duckdb::string_t,unsigned_long,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  Allocator *pAVar1;
  bool bVar2;
  OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
  *pOVar3;
  idx_t iVar4;
  ulong in_RCX;
  UnifiedVectorFormat *in_R8;
  string_t *input_value;
  HistogramAggState<duckdb::string_t,_duckdb::OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
  *state;
  idx_t idx;
  idx_t i;
  string_t *input_values;
  HistogramAggState<duckdb::string_t,_duckdb::OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
  **states;
  UnifiedVectorFormat input_data;
  Vector extra_state;
  UnifiedVectorFormat sdata;
  Vector *input;
  UnifiedVectorFormat *in_stack_fffffffffffffe70;
  OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
  *in_stack_fffffffffffffe78;
  Vector *in_stack_fffffffffffffe80;
  OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
  *this;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  UnifiedVectorFormat *this_00;
  idx_t in_stack_fffffffffffffea8;
  UnifiedVectorFormat *local_150;
  SelectionVector *local_138 [24];
  SelectionVector *local_78 [10];
  UnifiedVectorFormat *local_28;
  ulong local_20;
  
  this_00 = (UnifiedVectorFormat *)local_78;
  local_28 = in_R8;
  local_20 = in_RCX;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(this_00);
  duckdb::Vector::ToUnifiedFormat(local_20,local_28);
  HistogramGenericFunctor::CreateExtraState(in_stack_fffffffffffffea8);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_138);
  HistogramGenericFunctor::PrepareData
            ((Vector *)this_00,CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
             in_stack_fffffffffffffe80,(UnifiedVectorFormat *)in_stack_fffffffffffffe78);
  pOVar3 = (OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
            *)UnifiedVectorFormat::
              GetData<duckdb::HistogramAggState<duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::map<duckdb::string_t,unsigned_long,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>*>
                        ((UnifiedVectorFormat *)local_78);
  UnifiedVectorFormat::GetData<duckdb::string_t>((UnifiedVectorFormat *)local_138);
  for (local_150 = (UnifiedVectorFormat *)0x0; local_150 < local_28; local_150 = local_150 + 1) {
    SelectionVector::get_index(local_138[0],(idx_t)local_150);
    bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffe78,
                       (idx_t)in_stack_fffffffffffffe70);
    if (bVar2) {
      this = pOVar3;
      iVar4 = SelectionVector::get_index(local_78[0],(idx_t)local_150);
      pAVar1 = (&this->allocator)[iVar4];
      if (*(long *)pAVar1 == 0) {
        in_stack_fffffffffffffe78 =
             StringMapType<duckdb::OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
             ::CreateEmpty((ArenaAllocator *)this);
        *(OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
          **)pAVar1 = in_stack_fffffffffffffe78;
      }
      in_stack_fffffffffffffe70 =
           (UnifiedVectorFormat *)
           OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
           ::operator[](this,(key_type *)in_stack_fffffffffffffe78);
      *(mapped_type *)in_stack_fffffffffffffe70 = *(mapped_type *)in_stack_fffffffffffffe70 + 1;
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffe70);
  Vector::~Vector((Vector *)in_stack_fffffffffffffe70);
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffe70);
  return;
}

Assistant:

static void HistogramUpdateFunction(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count,
                                    Vector &state_vector, idx_t count) {

	D_ASSERT(input_count == 1);

	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, typename MAP_TYPE::MAP_TYPE> *>(sdata);
	auto input_values = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			state.hist = MAP_TYPE::CreateEmpty(aggr_input.allocator);
		}
		auto &input_value = input_values[idx];
		++(*state.hist)[input_value];
	}
}